

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_half_comm(REF_MPI ref_mpi,REF_MPI *split_mpi_ptr)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_MPI *split_mpi_ptr_local;
  REF_MPI ref_mpi_local;
  
  ref_mpi_local._4_4_ = ref_mpi_create_from_comm(split_mpi_ptr,(void *)0x0);
  if (ref_mpi_local._4_4_ == 0) {
    ref_mpi_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x93,
           "ref_mpi_half_comm",(ulong)ref_mpi_local._4_4_,"create from NULL comm");
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_half_comm(REF_MPI ref_mpi, REF_MPI *split_mpi_ptr) {
#ifdef HAVE_MPI
  MPI_Comm split_comm;
  int color, rank;
  rank = ref_mpi_rank(ref_mpi);
  color = rank % 2;
  MPI_Comm_split(ref_mpi_comm(ref_mpi), color, rank, &split_comm);
  RSS(ref_mpi_create_from_comm(split_mpi_ptr, &split_comm), "split comm");
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  RSS(ref_mpi_create_from_comm(split_mpi_ptr, NULL), "create from NULL comm");
#endif

  return REF_SUCCESS;
}